

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::AddKeepPath(string *dir)

{
  char *pcVar1;
  allocator local_7d [13];
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string cdir;
  string *dir_local;
  
  cdir.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)local_30);
  CollapseFullPath(&local_70,(string *)cdir.field_2._8_8_);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,local_7d);
  Realpath(&local_50,(string *)local_30,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)local_7d);
  std::__cxx11::string::~string((string *)&local_70);
  AddTranslationPath((string *)local_30,(string *)cdir.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void SystemTools::AddKeepPath(const kwsys_stl::string& dir)
{
  kwsys_stl::string cdir;
  Realpath(SystemTools::CollapseFullPath(dir).c_str(), cdir);
  SystemTools::AddTranslationPath(cdir, dir);
}